

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey_hash.c
# Opt level: O0

void calculate_digest(char *hash,size_t hash_len,char *buffer,size_t buffer_len)

{
  int iVar1;
  char *end;
  char *p;
  size_t i;
  size_t buffer_len_local;
  char *buffer_local;
  size_t hash_len_local;
  char *hash_local;
  
  end = buffer;
  for (p = (char *)0x0; p < hash_len && end < buffer + buffer_len; p = p + 1) {
    iVar1 = snprintf(end,(long)(buffer + buffer_len) - (long)end,"%02X",(ulong)(byte)hash[(long)p]);
    end = end + iVar1;
  }
  return;
}

Assistant:

static void calculate_digest(const char *hash, size_t hash_len, char *buffer,
                             size_t buffer_len)
{
    size_t i;
    char *p = buffer;
    char *end = buffer + buffer_len;

    for(i = 0; i < hash_len && p < end; ++i) {
        p += snprintf(p, end - p, "%02X", (unsigned char)hash[i]);
    }
}